

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadPathArray
          (CrateReader *this,vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *d)

{
  bool bVar1;
  undefined1 local_40 [8];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> items;
  anon_class_8_1_8991fb9c ReadFn;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *d_local;
  CrateReader *this_local;
  
  items.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_40);
  bVar1 = ReadPathArray::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)
                     &items.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_40);
  if (bVar1) {
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)d,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_40);
  }
  else {
    ::std::__cxx11::string::operator+=((string *)&this->_err,"Failed to read Path vector.\n");
  }
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_40);
  return bVar1;
}

Assistant:

bool CrateReader::ReadPathArray(std::vector<Path> *d) {
  // array data is not compressed
  auto ReadFn = [this](std::vector<Path> &result) -> bool {
    uint64_t n{0};
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }

    if (n > _config.maxArrayElements) {
      _err += "Too many Path array elements.\n";
      return false;
    }

    CHECK_MEMORY_USAGE(size_t(n) * sizeof(crate::Index));

    std::vector<crate::Index> ivalue(static_cast<size_t>(n));

    if (!_sr->read(size_t(n) * sizeof(crate::Index),
                   size_t(n) * sizeof(crate::Index),
                   reinterpret_cast<uint8_t *>(ivalue.data()))) {
      _err += "Failed to read ListOp data.\n";
      return false;
    }

    // reconstruct
    result.resize(static_cast<size_t>(n));
    for (size_t i = 0; i < n; i++) {
      if (auto pv = GetPath(ivalue[i])) {
        result[i] = pv.value();
      } else {
        PUSH_ERROR("Invalid Index for Path.");
        return false;
      }
    }

    return true;
  };

  std::vector<Path> items;
  if (!ReadFn(items)) {
    _err += "Failed to read Path vector.\n";
    return false;
  }

  (*d) = items;

  return true;
}